

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_json_to_str(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                  JSValue indent)

{
  short sVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  JSValue JVar5;
  JSValue v;
  int iVar6;
  JSValueUnion JVar8;
  ulong uVar9;
  JSValueUnion JVar10;
  int32_t argc;
  int64_t iVar11;
  JSValueUnion JVar12;
  void *idx;
  StringBuffer *s;
  JSValue obj1;
  JSValue obj;
  JSValue val_00;
  JSValue v_00;
  JSValue this_obj;
  JSValue JVar14;
  JSValue v_01;
  JSValue JVar15;
  JSValue obj_00;
  JSValue JVar16;
  JSValue JVar17;
  JSValue holder_00;
  JSValue holder_01;
  JSValue holder_02;
  JSValue val_01;
  JSValue val_02;
  int64_t len;
  JSValueUnion local_a0;
  JSValueUnion local_98;
  JSValueUnion local_90;
  int64_t iStack_88;
  JSValueUnion local_80;
  ulong local_78;
  void *local_70;
  JSValueUnion local_68;
  void *local_60;
  JSValueUnion local_58;
  int64_t iStack_50;
  void *local_48;
  void *local_40;
  int64_t local_38;
  JSValueUnion JVar7;
  ulong uVar13;
  
  JVar17.tag = holder.tag;
  JVar7 = holder.u;
  local_58.ptr = (void *)(local_58 << 0x20);
  iStack_50 = 3;
  local_90.ptr = (void *)(local_90 << 0x20);
  iStack_88 = 3;
  uVar4 = (uint)holder.tag;
  _local_a0 = holder;
  switch(uVar4) {
  case 7:
    if (0x7fefffffffffffff < ((ulong)JVar7.ptr & 0x7fffffffffffffff)) {
      local_a0.ptr = (void *)(holder._4_8_ << 0x20);
      local_98 = (JSValueUnion)0x2;
    }
  case 0:
  case 1:
  case 2:
switchD_0012f3fe_caseD_0:
    s = jsc->b;
LAB_0012f40e:
    iVar6 = string_buffer_concat_value_free(s,_local_a0);
    return iVar6;
  case 0xfffffff9:
    _local_a0 = JS_ToQuotedStringFree(ctx,holder);
    if (local_a0._8_4_ != 6) goto switchD_0012f3fe_caseD_0;
    break;
  default:
    if ((0xfffffff4 < uVar4) && (iVar6 = *JVar7.ptr, *(int *)JVar7.ptr = iVar6 + -1, iVar6 < 2)) {
      __JS_FreeValueRT(ctx->rt,holder);
    }
    return 0;
  case 0xffffffff:
    sVar1 = *(short *)((long)JVar7.ptr + 6);
    if (sVar1 == 4) {
      _local_a0 = JS_ToNumberHintFree(ctx,holder,4);
      iVar6 = local_a0._8_4_;
    }
    else {
      if (sVar1 == 6) {
        iVar6 = string_buffer_concat_value(jsc->b,*(JSValue *)((long)JVar7.ptr + 0x30));
        if (uVar4 < 0xfffffff5) {
          return iVar6;
        }
        iVar2 = *local_a0.ptr;
        *(int *)local_a0.ptr = iVar2 + -1;
        if (1 < iVar2) {
          return iVar6;
        }
        JVar14.tag = JVar17.tag;
        JVar14.u.ptr = local_a0.ptr;
        __JS_FreeValueRT(ctx->rt,JVar14);
        return iVar6;
      }
      if (sVar1 != 5) {
        JVar14 = js_array_includes(ctx,jsc->stack,1,(JSValue *)&local_a0);
        if ((int)JVar14.tag == 6) {
LAB_0012f5f6:
          JVar14 = (JSValue)(ZEXT816(3) << 0x40);
        }
        else {
          iVar6 = JS_ToBoolFree(ctx,JVar14);
          if (iVar6 != 0) {
            JS_ThrowTypeError(ctx,"circular reference");
            goto LAB_0012f5f6;
          }
          if (0xfffffff4 < (uint)indent.tag) {
            *(int *)indent.u.ptr = *indent.u.ptr + 1;
          }
          piVar3 = (int *)(jsc->gap).u.ptr;
          JVar14 = jsc->gap;
          if (0xfffffff4 < (uint)(jsc->gap).tag) {
            *piVar3 = *piVar3 + 1;
          }
          _local_58 = JS_ConcatString(ctx,indent,JVar14);
          if (local_58._8_4_ == 6) goto LAB_0012f5f6;
          if (((int)(jsc->gap).tag == -7) &&
             ((*(ulong *)((long)(jsc->gap).u.ptr + 4) & 0x7fffffff) == 0)) {
            local_60 = (void *)indent.tag;
            piVar3 = (int *)(jsc->empty).u.ptr;
            JVar14 = jsc->empty;
            if (0xfffffff4 < (uint)(jsc->empty).tag) {
              *piVar3 = *piVar3 + 1;
            }
            piVar3 = (int *)(jsc->empty).u.ptr;
            v_01 = jsc->empty;
            if (0xfffffff4 < (uint)(jsc->empty).tag) {
              *piVar3 = *piVar3 + 1;
            }
LAB_0012f8d0:
            local_68 = indent.u;
            JVar7.ptr = &local_a0;
            JVar15 = js_array_push(ctx,jsc->stack,1,(JSValue *)JVar7.ptr,0);
            iVar6 = check_exception_free(ctx,JVar15);
            if (iVar6 == 0) {
              JVar10 = local_a0;
              JVar15.tag = JVar17.tag;
              JVar15.u.ptr = local_a0.ptr;
              iVar6 = JS_IsArray(ctx,JVar15);
              if (-1 < iVar6) {
                if (iVar6 == 0) {
                  local_80.float64 = JVar10.float64;
                  iVar11 = (jsc->property_list).tag;
                  if ((uint)iVar11 == 3) {
                    JVar7.float64 = 0.0;
                    obj1.tag = JVar17.tag;
                    obj1.u.ptr = JVar10.ptr;
                    obj_00 = JS_GetOwnPropertyNames2(ctx,obj1,0x11,0);
                  }
                  else {
                    JVar10 = (JSValueUnion)(jsc->property_list).u.ptr;
                    JVar5.tag = iVar11;
                    JVar5.u.ptr = JVar10.ptr;
                    obj_00.tag = iVar11;
                    obj_00.u.ptr = JVar10.ptr;
                    if (0xfffffff4 < (uint)iVar11) {
                      *(int *)JVar10.ptr = *JVar10.ptr + 1;
                      obj_00 = JVar5;
                    }
                  }
                  argc = (int32_t)obj_00.tag;
                  if ((argc == 6) ||
                     (iVar6 = js_get_length64(ctx,(int64_t *)&local_48,obj_00), iVar6 != 0))
                  goto LAB_0012f60c;
                  string_buffer_putc8(jsc->b,0x7b);
                  local_60 = local_48;
                  local_70 = (void *)CONCAT44(local_70._4_4_,0x7d);
                  if (0 < (long)local_48) {
                    idx = (void *)0x0;
                    local_68 = local_98;
                    local_78 = local_78 & 0xffffffff00000000;
                    do {
                      JS_FreeValue(ctx,_local_90);
                      _local_90 = JS_GetPropertyInt64(ctx,obj_00,(int64_t)idx);
                      JVar10 = local_68;
                      JVar7 = local_80;
                      if (local_90._8_4_ == 6) goto LAB_0012f60c;
                      if (0xfffffff4 < local_90._8_4_) {
                        *(int *)local_90.ptr = *local_90.ptr + 1;
                      }
                      this_obj.tag = (int64_t)local_68.ptr;
                      this_obj.u.ptr = local_80.ptr;
                      JVar17 = JS_GetPropertyValue(ctx,this_obj,_local_90);
                      if ((int)JVar17.tag == 6) goto LAB_0012f60c;
                      holder_02.tag = (int64_t)JVar10.ptr;
                      holder_02.u.ptr = JVar7.ptr;
                      JVar15 = js_json_check(ctx,jsc,holder_02,JVar17,_local_90);
                      argc = JVar10.int32;
                      iVar6 = (int)JVar15.tag;
                      if (iVar6 != 3) {
                        if (iVar6 == 6) goto LAB_0012f60c;
                        if ((int)local_78 != 0) {
                          string_buffer_putc8(jsc->b,0x2c);
                        }
                        _local_90 = JS_ToQuotedStringFree(ctx,_local_90);
                        if (local_90._8_4_ == 6) {
                          JS_FreeValue(ctx,JVar15);
                          goto LAB_0012f60c;
                        }
                        string_buffer_concat_value(jsc->b,JVar14);
                        string_buffer_concat_value(jsc->b,_local_90);
                        string_buffer_putc8(jsc->b,0x3a);
                        string_buffer_concat_value(jsc->b,v_01);
                        argc = iVar6;
                        iVar6 = js_json_to_str(ctx,jsc,JVar15,JVar17,_local_58);
                        local_78 = CONCAT44(local_78._4_4_,1);
                        if (iVar6 != 0) goto LAB_0012f60c;
                      }
                      JVar7 = JVar17.u;
                      idx = (void *)((long)idx + 1);
                    } while (local_60 != idx);
                    if (((int)local_78 != 0) &&
                       ((*(uint *)((long)(jsc->gap).u.ptr + 4) & 0x7fffffff) != 0)) {
                      string_buffer_putc8(jsc->b,10);
                      string_buffer_concat_value(jsc->b,indent);
                      JVar7 = JVar17.u;
                    }
                  }
                }
                else {
                  JVar17.u.ptr = JVar10.ptr;
                  iVar11 = JVar17.tag;
                  iVar6 = js_get_length64(ctx,(int64_t *)&local_48,JVar17);
                  argc = (int32_t)iVar11;
                  if (iVar6 != 0) goto LAB_0012f935;
                  local_80.float64 = JVar10.float64;
                  string_buffer_putc8(jsc->b,0x5b);
                  local_40 = local_48;
                  if (0 < (long)local_48) {
                    local_38 = (int64_t)local_98;
                    local_70 = (void *)0x80000000;
                    JVar10.float64 = 0.0;
                    do {
                      if (JVar10.ptr != (void *)0x0) {
                        string_buffer_putc8(jsc->b,0x2c);
                      }
                      string_buffer_concat_value(jsc->b,JVar14);
                      obj.tag = JVar17.tag;
                      obj.u.ptr = local_80.ptr;
                      JVar16 = JS_GetPropertyInt64(ctx,obj,(int64_t)JVar10);
                      local_78 = JVar16.tag;
                      JVar7 = JVar16.u;
                      if ((int)JVar16.tag == 6) {
LAB_0012fcba:
                        local_78 = JVar16.tag;
                        obj_00 = (JSValue)(ZEXT816(3) << 0x40);
                        goto LAB_0012f60c;
                      }
                      JVar8.float64 = (double)JVar10.float64;
                      if (JVar10.ptr < local_70) {
                        JVar8 = JVar10;
                      }
                      iVar11 = 7;
                      if (JVar10.ptr < local_70) {
                        iVar11 = 0;
                      }
                      val_00.tag = iVar11;
                      val_00.u.float64 = JVar8.float64;
                      _local_90 = JS_ToStringFree(ctx,val_00);
                      JVar16.tag = local_78;
                      JVar16.u.ptr = JVar7.ptr;
                      if (local_90._8_4_ == 6) goto LAB_0012fcba;
                      holder_00.tag = local_38;
                      holder_00.u.ptr = local_80.ptr;
                      val_01.tag = local_78;
                      val_01.u.ptr = JVar7.ptr;
                      uVar13 = local_78;
                      JVar15 = js_json_check(ctx,jsc,holder_00,val_01,_local_90);
                      JVar8 = JVar15.u;
                      JS_FreeValue(ctx,_local_90);
                      JVar16.tag = local_78;
                      JVar16.u.ptr = JVar8.ptr;
                      local_90.ptr = (void *)(local_90 << 0x20);
                      iStack_88 = 3;
                      uVar9 = JVar15.tag & 0xffffffff;
                      if (uVar9 == 6) goto LAB_0012fcba;
                      JVar12.float64 = 0.0;
                      if (uVar9 != 3) {
                        JVar12 = JVar8;
                      }
                      uVar9 = 2;
                      if ((int)JVar15.tag != 3) {
                        uVar9 = JVar15.tag;
                      }
                      holder_01.tag = uVar9;
                      holder_01.u.float64 = JVar12.float64;
                      val_02.tag = uVar13;
                      val_02.u.ptr = JVar7.ptr;
                      iVar6 = js_json_to_str(ctx,jsc,holder_01,val_02,_local_58);
                      JVar16.tag = local_78;
                      argc = (int32_t)uVar9;
                      if (iVar6 != 0) goto LAB_0012fcba;
                      JVar10.float64 = JVar10.float64 + 1;
                    } while (local_40 != JVar10.ptr);
                  }
                  local_70 = (void *)CONCAT44(local_70._4_4_,0x5d);
                  if (0 < (long)local_40) {
                    argc = -7;
                    if (((int)(jsc->gap).tag != -7) ||
                       ((*(ulong *)((long)(jsc->gap).u.ptr + 4) & 0x7fffffff) != 0)) {
                      argc = -7;
                      string_buffer_putc8(jsc->b,10);
                      v.tag = (int64_t)local_60;
                      v.u.float64 = local_68.float64;
                      string_buffer_concat_value(jsc->b,v);
                    }
                  }
                  obj_00 = (JSValue)(ZEXT816(3) << 0x40);
                }
                string_buffer_putc8(jsc->b,(uint32_t)local_70);
                JVar17 = js_array_pop(ctx,jsc->stack,argc,(JSValue *)JVar7.ptr,0);
                iVar6 = check_exception_free(ctx,JVar17);
                if (iVar6 == 0) {
                  v_00.tag = (int64_t)local_98;
                  v_00.u.float64 = local_80.float64;
                  JS_FreeValue(ctx,v_00);
                  JS_FreeValue(ctx,obj_00);
                  JS_FreeValue(ctx,JVar14);
                  JS_FreeValue(ctx,v_01);
                  JS_FreeValue(ctx,_local_58);
                  JS_FreeValue(ctx,_local_90);
                  return 0;
                }
                goto LAB_0012f60c;
              }
            }
LAB_0012f935:
            obj_00 = (JSValue)(ZEXT816(3) << 0x40);
            goto LAB_0012f60c;
          }
          if (0xfffffff4 < local_58._8_4_) {
            *(int *)local_58.ptr = *local_58.ptr + 1;
          }
          JVar14 = JS_ConcatString3(ctx,"\n",_local_58,"");
          if ((int)JVar14.tag != 6) {
            local_60 = (void *)indent.tag;
            v_01 = JS_NewStringLen(ctx," ",1);
            if ((int)v_01.tag != 6) goto LAB_0012f8d0;
            goto LAB_0012f935;
          }
        }
        v_01 = (JSValue)(ZEXT816(3) << 0x40);
        obj_00 = (JSValue)(ZEXT816(3) << 0x40);
        goto LAB_0012f60c;
      }
      _local_a0 = JS_ToStringFree(ctx,holder);
      if (local_a0._8_4_ == 6) break;
      _local_a0 = JS_ToQuotedStringFree(ctx,_local_a0);
      iVar6 = local_a0._8_4_;
    }
    if (iVar6 != 6) {
      s = jsc->b;
      goto LAB_0012f40e;
    }
  }
  obj_00 = (JSValue)(ZEXT816(3) << 0x40);
  v_01 = (JSValue)(ZEXT816(3) << 0x40);
  JVar14 = (JSValue)(ZEXT816(3) << 0x40);
LAB_0012f60c:
  if ((0xfffffff4 < local_a0._8_4_) &&
     (iVar6 = *local_a0.ptr, *(int *)local_a0.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_a0);
  }
  if ((0xfffffff4 < (uint)obj_00.tag) &&
     (iVar6 = *obj_00.u.ptr, *(int *)obj_00.u.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,obj_00);
  }
  if ((0xfffffff4 < (uint)JVar14.tag) &&
     (iVar6 = *JVar14.u.ptr, *(int *)JVar14.u.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar14);
  }
  if ((0xfffffff4 < (uint)v_01.tag) &&
     (iVar6 = *v_01.u.ptr, *(int *)v_01.u.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,v_01);
  }
  if ((0xfffffff4 < local_58._8_4_) &&
     (iVar6 = *local_58.ptr, *(int *)local_58.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_58);
  }
  if ((0xfffffff4 < local_90._8_4_) &&
     (iVar6 = *local_90.ptr, *(int *)local_90.ptr = iVar6 + -1, iVar6 < 2)) {
    __JS_FreeValueRT(ctx->rt,_local_90);
  }
  return -1;
}

Assistant:

static int js_json_to_str(JSContext *ctx, JSONStringifyContext *jsc,
                          JSValueConst holder, JSValue val,
                          JSValueConst indent)
{
    JSValue indent1, sep, sep1, tab, v, prop;
    JSObject *p;
    int64_t i, len;
    int cl, ret;
    BOOL has_content;
    
    indent1 = JS_UNDEFINED;
    sep = JS_UNDEFINED;
    sep1 = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    prop = JS_UNDEFINED;

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        p = JS_VALUE_GET_OBJ(val);
        cl = p->class_id;
        if (cl == JS_CLASS_STRING) {
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            val = JS_ToQuotedStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_NUMBER) {
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BOOLEAN) {
            ret = string_buffer_concat_value(jsc->b, p->u.object_data);
            JS_FreeValue(ctx, val);
            return ret;
        }
#ifdef CONFIG_BIGNUM
        else if (cl == JS_CLASS_BIG_FLOAT) {
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BIG_INT) {
            JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
            goto exception;
        }
#endif
        v = js_array_includes(ctx, jsc->stack, 1, (JSValueConst *)&val);
        if (JS_IsException(v))
            goto exception;
        if (JS_ToBoolFree(ctx, v)) {
            JS_ThrowTypeError(ctx, "circular reference");
            goto exception;
        }
        indent1 = JS_ConcatString(ctx, JS_DupValue(ctx, indent), JS_DupValue(ctx, jsc->gap));
        if (JS_IsException(indent1))
            goto exception;
        if (!JS_IsEmptyString(jsc->gap)) {
            sep = JS_ConcatString3(ctx, "\n", JS_DupValue(ctx, indent1), "");
            if (JS_IsException(sep))
                goto exception;
            sep1 = JS_NewString(ctx, " ");
            if (JS_IsException(sep1))
                goto exception;
        } else {
            sep = JS_DupValue(ctx, jsc->empty);
            sep1 = JS_DupValue(ctx, jsc->empty);
        }
        v = js_array_push(ctx, jsc->stack, 1, (JSValueConst *)&val, 0);
        if (check_exception_free(ctx, v))
            goto exception;
        ret = JS_IsArray(ctx, val);
        if (ret < 0)
            goto exception;
        if (ret) {
            if (js_get_length64(ctx, &len, val))
                goto exception;
            string_buffer_putc8(jsc->b, '[');
            for(i = 0; i < len; i++) {
                if (i > 0)
                    string_buffer_putc8(jsc->b, ',');
                string_buffer_concat_value(jsc->b, sep);
                v = JS_GetPropertyInt64(ctx, val, i);
                if (JS_IsException(v))
                    goto exception;
                /* XXX: could do this string conversion only when needed */
                prop = JS_ToStringFree(ctx, JS_NewInt64(ctx, i));
                if (JS_IsException(prop))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                JS_FreeValue(ctx, prop);
                prop = JS_UNDEFINED;
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsUndefined(v))
                    v = JS_NULL;
                if (js_json_to_str(ctx, jsc, val, v, indent1))
                    goto exception;
            }
            if (len > 0 && !JS_IsEmptyString(jsc->gap)) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, ']');
        } else {
            if (!JS_IsUndefined(jsc->property_list))
                tab = JS_DupValue(ctx, jsc->property_list);
            else
                tab = js_object_keys(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val, JS_ITERATOR_KIND_KEY);
            if (JS_IsException(tab))
                goto exception;
            if (js_get_length64(ctx, &len, tab))
                goto exception;
            string_buffer_putc8(jsc->b, '{');
            has_content = FALSE;
            for(i = 0; i < len; i++) {
                JS_FreeValue(ctx, prop);
                prop = JS_GetPropertyInt64(ctx, tab, i);
                if (JS_IsException(prop))
                    goto exception;
                v = JS_GetPropertyValue(ctx, val, JS_DupValue(ctx, prop));
                if (JS_IsException(v))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                if (JS_IsException(v))
                    goto exception;
                if (!JS_IsUndefined(v)) {
                    if (has_content)
                        string_buffer_putc8(jsc->b, ',');
                    prop = JS_ToQuotedStringFree(ctx, prop);
                    if (JS_IsException(prop)) {
                        JS_FreeValue(ctx, v);
                        goto exception;
                    }
                    string_buffer_concat_value(jsc->b, sep);
                    string_buffer_concat_value(jsc->b, prop);
                    string_buffer_putc8(jsc->b, ':');
                    string_buffer_concat_value(jsc->b, sep1);
                    if (js_json_to_str(ctx, jsc, val, v, indent1))
                        goto exception;
                    has_content = TRUE;
                }
            }
            if (has_content && JS_VALUE_GET_STRING(jsc->gap)->len != 0) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, '}');
        }
        if (check_exception_free(ctx, js_array_pop(ctx, jsc->stack, 0, NULL, 0)))
            goto exception;
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, tab);
        JS_FreeValue(ctx, sep);
        JS_FreeValue(ctx, sep1);
        JS_FreeValue(ctx, indent1);
        JS_FreeValue(ctx, prop);
        return 0;
    case JS_TAG_STRING:
        val = JS_ToQuotedStringFree(ctx, val);
        if (JS_IsException(val))
            goto exception;
        goto concat_value;
    case JS_TAG_FLOAT64:
        if (!isfinite(JS_VALUE_GET_FLOAT64(val))) {
            val = JS_NULL;
        }
        goto concat_value;
    case JS_TAG_INT:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    concat_value:
        return string_buffer_concat_value_free(jsc->b, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
        goto exception;
#endif
    default:
        JS_FreeValue(ctx, val);
        return 0;
    }
    
exception:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, sep1);
    JS_FreeValue(ctx, indent1);
    JS_FreeValue(ctx, prop);
    return -1;
}